

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O3

bool __thiscall PDA::addTransition(PDA *this,Transition *transition)

{
  char cVar1;
  pointer pcVar2;
  char *pcVar3;
  bool bVar4;
  char cVar5;
  char *pcVar6;
  string local_b8;
  Transition *local_98;
  string local_90;
  string local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  Transition *local_38;
  
  pcVar2 = (transition->stateFrom->name)._M_dataplus._M_p;
  local_98 = transition;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + (transition->stateFrom->name)._M_string_length);
  bVar4 = containsState(this,&local_70);
  if (!bVar4) {
    bVar4 = false;
    goto LAB_0011a8a4;
  }
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  pcVar2 = (transition->stateTo->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar2,pcVar2 + (transition->stateTo->name)._M_string_length);
  bVar4 = containsState(this,&local_b8);
  if (bVar4) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_50,&transition->stackPush);
    bVar4 = inStackAlphabet(this,&local_50);
    if (bVar4) {
      pcVar6 = (this->inputAlphabetS).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar3 = (this->inputAlphabetS).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pcVar6 == pcVar3) goto LAB_0011a882;
      cVar1 = transition->input;
      do {
        if (*pcVar6 == cVar1) {
LAB_0011a949:
          pcVar2 = (transition->stackInput)._M_dataplus._M_p;
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,pcVar2,pcVar2 + (transition->stackInput)._M_string_length);
          bVar4 = inStackAlphabet(this,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          goto LAB_0011a884;
        }
        cVar5 = getEPSILON();
        if (cVar5 == cVar1) goto LAB_0011a949;
        pcVar6 = pcVar6 + 1;
      } while (pcVar6 != pcVar3);
      bVar4 = false;
    }
    else {
LAB_0011a882:
      bVar4 = false;
    }
LAB_0011a884:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_50);
  }
  else {
    bVar4 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
LAB_0011a8a4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (bVar4 == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error adding transition",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
    std::ostream::put('`');
    std::ostream::flush();
  }
  else {
    std::vector<Transition*,std::allocator<Transition*>>::emplace_back<Transition*&>
              ((vector<Transition*,std::allocator<Transition*>> *)&this->transitionFunctionD,
               &local_98);
    local_38 = local_98;
    std::vector<Transition*,std::allocator<Transition*>>::emplace_back<Transition*&>
              ((vector<Transition*,std::allocator<Transition*>> *)
               &local_98->stateFrom->transitionsFrom,&local_38);
  }
  return bVar4;
}

Assistant:

bool PDA::addTransition(Transition *transition) {
    if (containsState(transition->getStateFrom()->getName()) &&
        containsState(transition->getStateTo()->getName()) &&
        inStackAlphabet(transition->getStackPush()) &&
        inAlphabet(transition->getInput()) &&
        inStackAlphabet(transition->getStackInput())) {
        transitionFunctionD.emplace_back(transition);
        transition->getStateFrom()->addTransition(transition);
        return true;
    } else {
        std::cerr << "Error adding transition" << std::endl;
    }
    return false;
}